

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void mp_dump(FILE *fp,char *prefix,mp_int *x,char *suffix)

{
  byte bVar1;
  size_t local_30;
  size_t i;
  char *suffix_local;
  mp_int *x_local;
  char *prefix_local;
  FILE *fp_local;
  
  fprintf((FILE *)fp,"%s0x",prefix);
  local_30 = mp_max_bytes(x);
  while (local_30 != 0) {
    bVar1 = mp_get_byte(x,local_30 - 1);
    fprintf((FILE *)fp,"%02X",(ulong)bVar1);
    local_30 = local_30 - 1;
  }
  fputs(suffix,(FILE *)fp);
  return;
}

Assistant:

void mp_dump(FILE *fp, const char *prefix, mp_int *x, const char *suffix)
{
    fprintf(fp, "%s0x", prefix);
    for (size_t i = mp_max_bytes(x); i-- > 0 ;)
        fprintf(fp, "%02X", mp_get_byte(x, i));
    fputs(suffix, fp);
}